

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O3

int Cmd_CommandAbcPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  size_t sVar2;
  Abc_Frame_t *pAVar3;
  Gia_Man_t **ppGVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  void *pvVar9;
  char *pcVar10;
  size_t sVar11;
  FILE *__stream;
  Vec_Int_t *pVVar12;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p;
  Gia_Man_t *pGVar13;
  int iVar14;
  char *pcVar15;
  abctime time;
  uint uVar16;
  char **__s;
  int i;
  ulong uVar17;
  long lVar18;
  char *pFileIn;
  timespec ts;
  char *local_80;
  char *local_78;
  char **local_70;
  char *local_68;
  int local_5c;
  Abc_Frame_t *local_58;
  char *local_50;
  Gia_Man_t **local_48;
  timespec local_40;
  
  local_70 = argv;
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    if ((((argc == 2) && (pcVar10 = argv[1], *pcVar10 == '-')) && (pcVar10[1] == 'h')) &&
       (pcVar10[2] == '\0')) {
      puVar8 = (uint *)malloc(0x10);
      puVar8[0] = 100;
      puVar8[1] = 0;
      pvVar9 = malloc(100);
      *(void **)(puVar8 + 2) = pvVar9;
      pcVar10 = Abc_GetBinaryName(pAbc,argc,local_70);
      sVar11 = strlen(pcVar10);
      if (0 < (int)(uint)sVar11) {
        pcVar15 = (char *)(ulong)((uint)sVar11 & 0x7fffffff);
        uVar17 = 0;
        local_78 = pcVar15;
        local_50 = pcVar10;
        do {
          cVar1 = pcVar10[uVar17];
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
              pcVar15 = local_78;
            }
            else {
              sVar11 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar11);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar11;
              pcVar15 = local_78;
              pcVar10 = local_50;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          puVar8[1] = uVar16 + 1;
          *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
          uVar17 = uVar17 + 1;
        } while (pcVar15 != (char *)uVar17);
      }
      lVar18 = 0;
      do {
        cVar1 = " -abc "[lVar18];
        uVar16 = puVar8[1];
        if (uVar16 == *puVar8) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x10);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar16 * 2;
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(sVar11);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = (uint)sVar11;
          }
        }
        else {
          pvVar9 = *(void **)(puVar8 + 2);
        }
        puVar8[1] = uVar16 + 1;
        *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      __s = (char **)*local_70;
      sVar11 = strlen((char *)__s);
      if (0 < (int)(uint)sVar11) {
        pcVar10 = (char *)(ulong)((uint)sVar11 & 0x7fffffff);
        uVar17 = 0;
        local_78 = pcVar10;
        local_70 = __s;
        do {
          cVar1 = *(char *)((long)__s + uVar17);
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
              pcVar10 = local_78;
            }
            else {
              sVar11 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar11);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar11;
              pcVar10 = local_78;
              __s = local_70;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          puVar8[1] = uVar16 + 1;
          *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
          uVar17 = uVar17 + 1;
        } while (pcVar10 != (char *)uVar17);
      }
      lVar18 = 0;
      do {
        cVar1 = "%s -h"[lVar18 + 2];
        uVar16 = puVar8[1];
        if (uVar16 == *puVar8) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x10);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar16 * 2;
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(sVar11);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = (uint)sVar11;
          }
        }
        else {
          pvVar9 = *(void **)(puVar8 + 2);
        }
        puVar8[1] = uVar16 + 1;
        *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      uVar16 = puVar8[1];
      if (uVar16 == *puVar8) {
        if ((int)uVar16 < 0x10) {
          if (*(void **)(puVar8 + 2) == (void *)0x0) {
            pvVar9 = malloc(0x10);
          }
          else {
            pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
          }
          *(void **)(puVar8 + 2) = pvVar9;
          *puVar8 = 0x10;
        }
        else {
          sVar11 = (ulong)uVar16 * 2;
          if (*(void **)(puVar8 + 2) == (void *)0x0) {
            pvVar9 = malloc(sVar11);
          }
          else {
            pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
          }
          *(void **)(puVar8 + 2) = pvVar9;
          *puVar8 = (uint)sVar11;
        }
      }
      else {
        pvVar9 = *(void **)(puVar8 + 2);
      }
      puVar8[1] = uVar16 + 1;
      *(undefined1 *)((long)pvVar9 + (long)(int)uVar16) = 0;
      pcVar10 = *(char **)(puVar8 + 2);
      Util_SignalSystem(pcVar10);
      if (pcVar10 != (char *)0x0) {
        free(pcVar10);
      }
      free(puVar8);
      return 1;
    }
    pcVar10 = "Current AIG does not exist (try command &ps).\n";
    goto LAB_002be95e;
  }
  iVar5 = Util_SignalTmpFile("__abctmp_",".aig",&local_68);
  if (iVar5 != -1) {
    close(iVar5);
    iVar5 = Util_SignalTmpFile("__abctmp_",".out",&local_80);
    if (iVar5 != -1) {
      close(iVar5);
      if ((*local_70[(long)argc + -1] == '!') && (local_70[(long)argc + -1][1] == '\0')) {
        Abc_Print(0,"Input file \"%s\" and output file \"%s\" are not deleted.\n",local_68);
        local_78 = (char *)CONCAT44(local_78._4_4_,argc + -1);
        local_5c = 1;
      }
      else {
        local_78 = (char *)CONCAT44(local_78._4_4_,argc);
        local_5c = 0;
      }
      pcVar10 = local_68;
      Gia_AigerWrite(pAbc->pGia,local_68,0,0);
      iVar5 = (int)pcVar10;
      puVar8 = (uint *)malloc(0x10);
      puVar8[0] = 100;
      puVar8[1] = 0;
      pvVar9 = malloc(100);
      *(void **)(puVar8 + 2) = pvVar9;
      local_58 = pAbc;
      pcVar10 = Abc_GetBinaryName(pAbc,iVar5,local_70);
      sVar11 = strlen(pcVar10);
      if (0 < (int)(uint)sVar11) {
        uVar17 = 0;
        do {
          cVar1 = pcVar10[uVar17];
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
            }
            else {
              sVar2 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar2);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar2);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar2;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          uVar16 = puVar8[1];
          puVar8[1] = uVar16 + 1;
          *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
          uVar17 = uVar17 + 1;
        } while (((uint)sVar11 & 0x7fffffff) != uVar17);
      }
      local_48 = &local_58->pGia;
      lVar18 = 0;
      do {
        cVar1 = " -abc"[lVar18];
        uVar16 = puVar8[1];
        if (uVar16 == *puVar8) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x10);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar16 * 2;
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(sVar11);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = (uint)sVar11;
          }
        }
        else {
          pvVar9 = *(void **)(puVar8 + 2);
        }
        uVar16 = puVar8[1];
        puVar8[1] = uVar16 + 1;
        *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 5);
      lVar18 = 0;
      do {
        cVar1 = " -input="[lVar18];
        uVar16 = puVar8[1];
        if (uVar16 == *puVar8) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x10);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar16 * 2;
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(sVar11);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = (uint)sVar11;
          }
        }
        else {
          pvVar9 = *(void **)(puVar8 + 2);
        }
        pcVar10 = local_68;
        uVar16 = puVar8[1];
        puVar8[1] = uVar16 + 1;
        *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 8);
      sVar11 = strlen(local_68);
      if (0 < (int)(uint)sVar11) {
        uVar17 = 0;
        do {
          cVar1 = pcVar10[uVar17];
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
            }
            else {
              sVar2 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar2);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar2);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar2;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          uVar16 = puVar8[1];
          puVar8[1] = uVar16 + 1;
          *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
          uVar17 = uVar17 + 1;
        } while (((uint)sVar11 & 0x7fffffff) != uVar17);
      }
      lVar18 = 0;
      do {
        cVar1 = " -output="[lVar18];
        uVar16 = puVar8[1];
        if (uVar16 == *puVar8) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x10);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar16 * 2;
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar9 = malloc(sVar11);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
            }
            *(void **)(puVar8 + 2) = pvVar9;
            *puVar8 = (uint)sVar11;
          }
        }
        else {
          pvVar9 = *(void **)(puVar8 + 2);
        }
        pcVar10 = local_80;
        uVar16 = puVar8[1];
        puVar8[1] = uVar16 + 1;
        *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 9);
      sVar11 = strlen(local_80);
      if (0 < (int)(uint)sVar11) {
        uVar17 = 0;
        do {
          cVar1 = pcVar10[uVar17];
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
            }
            else {
              sVar2 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar2);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar2);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar2;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          uVar16 = puVar8[1];
          puVar8[1] = uVar16 + 1;
          *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
          uVar17 = uVar17 + 1;
        } while (((uint)sVar11 & 0x7fffffff) != uVar17);
      }
      if (0 < (int)local_78) {
        local_50 = (char *)((ulong)local_78 & 0xffffffff);
        pcVar10 = (char *)0x0;
        do {
          uVar16 = puVar8[1];
          if (uVar16 == *puVar8) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = 0x10;
            }
            else {
              sVar11 = (ulong)uVar16 * 2;
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar11);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
              }
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar11;
            }
          }
          else {
            pvVar9 = *(void **)(puVar8 + 2);
          }
          uVar16 = puVar8[1];
          puVar8[1] = uVar16 + 1;
          *(undefined1 *)((long)pvVar9 + (long)(int)uVar16) = 0x20;
          pcVar15 = local_70[(long)pcVar10];
          local_78 = pcVar10;
          sVar11 = strlen(pcVar15);
          if (0 < (int)(uint)sVar11) {
            uVar17 = 0;
            do {
              cVar1 = pcVar15[uVar17];
              uVar16 = puVar8[1];
              if (uVar16 == *puVar8) {
                if ((int)uVar16 < 0x10) {
                  if (*(void **)(puVar8 + 2) == (void *)0x0) {
                    pvVar9 = malloc(0x10);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
                  }
                  *(void **)(puVar8 + 2) = pvVar9;
                  *puVar8 = 0x10;
                }
                else {
                  sVar2 = (ulong)uVar16 * 2;
                  if (*(void **)(puVar8 + 2) == (void *)0x0) {
                    pvVar9 = malloc(sVar2);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(puVar8 + 2),sVar2);
                  }
                  *(void **)(puVar8 + 2) = pvVar9;
                  *puVar8 = (uint)sVar2;
                }
              }
              else {
                pvVar9 = *(void **)(puVar8 + 2);
              }
              uVar16 = puVar8[1];
              puVar8[1] = uVar16 + 1;
              *(char *)((long)pvVar9 + (long)(int)uVar16) = cVar1;
              uVar17 = uVar17 + 1;
            } while (((uint)sVar11 & 0x7fffffff) != uVar17);
          }
          pcVar10 = local_78 + 1;
        } while (pcVar10 != local_50);
      }
      uVar16 = puVar8[1];
      if (uVar16 == *puVar8) {
        if ((int)uVar16 < 0x10) {
          if (*(void **)(puVar8 + 2) == (void *)0x0) {
            pvVar9 = malloc(0x10);
          }
          else {
            pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
          }
          *(void **)(puVar8 + 2) = pvVar9;
          *puVar8 = 0x10;
        }
        else {
          sVar11 = (ulong)uVar16 * 2;
          if (*(void **)(puVar8 + 2) == (void *)0x0) {
            pvVar9 = malloc(sVar11);
          }
          else {
            pvVar9 = realloc(*(void **)(puVar8 + 2),sVar11);
          }
          *(void **)(puVar8 + 2) = pvVar9;
          *puVar8 = (uint)sVar11;
        }
      }
      else {
        pvVar9 = *(void **)(puVar8 + 2);
      }
      uVar16 = puVar8[1];
      puVar8[1] = uVar16 + 1;
      *(undefined1 *)((long)pvVar9 + (long)(int)uVar16) = 0;
      iVar5 = clock_gettime(3,&local_40);
      if (iVar5 < 0) {
        iVar5 = 1;
      }
      else {
        iVar5 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8) >> 7) -
                (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),0xc) >> 0x1f)) +
                (int)local_40.tv_sec * -1000000;
      }
      iVar6 = Util_SignalSystem(*(char **)(puVar8 + 2));
      if (iVar6 != 0) {
        Abc_Print(-1,"The following command has returned non-zero exit status:\n");
        local_80 = *(char **)(puVar8 + 2);
        pcVar10 = "\"%s\"\n";
LAB_002bea69:
        Abc_Print(-1,pcVar10,local_80);
        return 1;
      }
      iVar6 = clock_gettime(3,&local_40);
      if (iVar6 < 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
      }
      if (*(void **)(puVar8 + 2) != (void *)0x0) {
        free(*(void **)(puVar8 + 2));
      }
      free(puVar8);
      __stream = fopen(local_80,"r");
      if (__stream == (FILE *)0x0) {
        pcVar10 = "There is no output file \"%s\".\n";
        goto LAB_002bea69;
      }
      fclose(__stream);
      iVar7 = Extra_FileSize(local_80);
      if (iVar7 < 1) goto LAB_002bf011;
      iVar7 = Abc_ManReadStatus(local_80,"result:");
      pAVar3 = local_58;
      local_58->Status = iVar7;
      iVar7 = Abc_ManReadInteger(local_80,"bug-free-depth:");
      pAVar3->nFrames = iVar7;
      pVVar12 = Abc_ManReadBinary(local_80,"abstraction:");
      pAVar3->pGia->vFlopClasses = pVVar12;
      pVVar12 = Abc_ManReadBinary(local_80,"counter-example:");
      ppGVar4 = local_48;
      if (pVVar12 != (Vec_Int_t *)0x0) {
        iVar7 = (*local_48)->nRegs;
        iVar14 = pVVar12->nSize - iVar7;
        iVar7 = (*local_48)->vCis->nSize - iVar7;
        __ptr = pVVar12;
        if (iVar14 % iVar7 != 0) {
          Abc_Print(1,"Adjusting counter-example by adding zeros for PIs without fanout.\n");
          __ptr = Abc_ManExpandCex(*ppGVar4,pVVar12);
          Vec_IntFree(pVVar12);
          pGVar13 = *ppGVar4;
          iVar14 = pGVar13->nRegs;
          iVar7 = pGVar13->vCis->nSize - iVar14;
          iVar14 = __ptr->nSize - iVar14;
        }
        if (iVar14 % iVar7 == 0) {
          uVar16 = iVar14 / iVar7 - 1;
          pcVar10 = "Problem is satisfiable. Found counter-example in frame %d.  ";
          Abc_Print(1,"Problem is satisfiable. Found counter-example in frame %d.  ",(ulong)uVar16);
          Abc_PrintTime(iVar6 + iVar5,pcVar10,time);
          pAVar3 = local_58;
          if (local_58->pCex != (Abc_Cex_t *)0x0) {
            free(local_58->pCex);
            pAVar3->pCex = (Abc_Cex_t *)0x0;
          }
          iVar5 = pAVar3->pGia->nRegs;
          p = Abc_CexCreate(iVar5,pAVar3->pGia->vCis->nSize - iVar5,__ptr->pArray,uVar16,0,0);
          pAVar3->pCex = p;
          iVar5 = Gia_ManFindFailedPoCex(pAVar3->pGia,p,0);
          pAVar3->pCex->iPo = iVar5;
          if (iVar5 != -1) {
            pcVar10 = "Returned counter-example successfully verified in ABC.\n";
            goto LAB_002befc5;
          }
          Abc_Print(1,"Generated counter-example is INVALID.\n");
          if (pAVar3->pCex != (Abc_Cex_t *)0x0) {
            free(pAVar3->pCex);
            pAVar3->pCex = (Abc_Cex_t *)0x0;
          }
        }
        else {
          pcVar10 = "Counter example has a wrong length.\n";
LAB_002befc5:
          Abc_Print(1,pcVar10);
        }
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      pGVar13 = Abc_ManReadAig(local_80,"aig:");
      ppGVar4 = local_48;
      if (pGVar13 != (Gia_Man_t *)0x0) {
        Gia_ManStopP(local_48);
        *ppGVar4 = pGVar13;
      }
LAB_002bf011:
      iVar5 = local_5c;
      Util_SignalTmpFileRemove(local_68,local_5c);
      Util_SignalTmpFileRemove(local_80,iVar5);
      if (local_68 != (char *)0x0) {
        free(local_68);
        local_68 = (char *)0x0;
      }
      if (local_80 != (char *)0x0) {
        free(local_80);
        return 0;
      }
      return 0;
    }
    if (local_68 != (char *)0x0) {
      free(local_68);
      local_68 = (char *)0x0;
    }
  }
  pcVar10 = "Cannot create a temporary file.\n";
LAB_002be95e:
  Abc_Print(-1,pcVar10);
  return 1;
}

Assistant:

int Cmd_CommandAbcPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileIn, * pFileOut;
    Vec_Str_t * vCommand;
    Vec_Int_t * vCex;
    FILE * pFile;
    Gia_Man_t * pGia;
    int i, fd;
    abctime clk;
    int fLeaveFiles;
/*
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Current network does not exist\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pNtk) )
    {
        Abc_Print( -1, "The current network is not an AIG. Cannot continue.\n" );
        return 1;
    }
*/

    if ( pAbc->pGia == NULL )
    {
        if (argc == 2 && strcmp(argv[1], "-h") == 0)
        {
            // Run command to produce help string:
            vCommand = Vec_StrAlloc( 100 );
            Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
            Vec_StrAppend( vCommand, " -abc " );
            Vec_StrAppend( vCommand, argv[0] );
            Vec_StrAppend( vCommand, " -h" );
            Vec_StrPush( vCommand, 0 );
            Util_SignalSystem( Vec_StrArray(vCommand) );
            Vec_StrFree( vCommand );
        }
        else
        {
            Abc_Print( -1, "Current AIG does not exist (try command &ps).\n" );
        }
        return 1;
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".aig", &pFileIn );
    if ( fd == -1 )
    {
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".out", &pFileOut );
    if ( fd == -1 )
    {
        ABC_FREE( pFileIn );
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif


    // write current network into a file
/*
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig;
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Ioa_WriteAiger( pAig, pFileIn, 0, 0 );
        Aig_ManStop( pAig );
    }
*/ 
    // check what to do with the files
    fLeaveFiles = 0;
    if ( strcmp( argv[argc-1], "!" ) == 0 )
    {
        Abc_Print( 0, "Input file \"%s\" and output file \"%s\" are not deleted.\n", pFileIn, pFileOut );
        fLeaveFiles = 1;
        argc--;
    }

    // create input file
    Gia_AigerWrite( pAbc->pGia, pFileIn, 0, 0 );

    // create command line
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
    // add input/output file
    Vec_StrAppend( vCommand, " -abc" );
//    Vec_StrAppend( vCommand, " -input=C:/_projects/abc/_TEST/hwmcc/139442p0.aig" );
    Vec_StrAppend( vCommand, " -input=" );
    Vec_StrAppend( vCommand, pFileIn );
    Vec_StrAppend( vCommand, " -output=" );
    Vec_StrAppend( vCommand, pFileOut );
    // add other arguments
    for ( i = 0; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );

    // run the command line
//printf( "Running command line: %s\n", Vec_StrArray(vCommand) ); 

    clk = Abc_Clock();
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    clk = Abc_Clock() - clk;
    Vec_StrFree( vCommand );

    // check if the output file exists
    if ( (pFile = fopen( pFileOut, "r" )) == NULL )
    {
        Abc_Print( -1, "There is no output file \"%s\".\n", pFileOut );
        return 1;
    }
    fclose( pFile );

    // process the output
    if ( Extra_FileSize(pFileOut) > 0 )
    {
        // get status
        pAbc->Status  = Abc_ManReadStatus( pFileOut, "result:" );
        // get bug-free depth
        pAbc->nFrames = Abc_ManReadInteger( pFileOut, "bug-free-depth:" );
        // get abstraction
        pAbc->pGia->vFlopClasses = Abc_ManReadBinary( pFileOut, "abstraction:" );
        // get counter-example
        vCex = Abc_ManReadBinary( pFileOut, "counter-example:" );
        if ( vCex ) 
        {
            int nFrames, nRemain;

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
            {   
                Vec_Int_t * vTemp;
                Abc_Print( 1, "Adjusting counter-example by adding zeros for PIs without fanout.\n" );
                // expand the counter-example to include PIs without fanout
                vCex = Abc_ManExpandCex( pAbc->pGia, vTemp = vCex );
                Vec_IntFree( vTemp );
            }

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
                Abc_Print( 1, "Counter example has a wrong length.\n" );
            else
            {
                Abc_Print( 1, "Problem is satisfiable. Found counter-example in frame %d.  ", nFrames-1 );
                Abc_PrintTime( 1, "Time", clk );
                ABC_FREE( pAbc->pCex );
                pAbc->pCex = Abc_CexCreate( Gia_ManRegNum(pAbc->pGia), Gia_ManPiNum(pAbc->pGia), Vec_IntArray(vCex), nFrames-1, 0, 0 );

//                Abc_CexPrint( pAbc->pCex );

//                if ( !Gia_ManVerifyCex( pAbc->pGia, pAbc->pCex, 0 ) )
//                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );

                // remporary work-around to detect the output number - October 18, 2010
                pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, 0 );
                if ( pAbc->pCex->iPo == -1 )
                {
                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );
                    ABC_FREE( pAbc->pCex );
                }
                else
                {
                    Abc_Print( 1, "Returned counter-example successfully verified in ABC.\n" );
                }
            }
            Vec_IntFreeP( &vCex );
        }
        // get AIG if present
        pGia = Abc_ManReadAig( pFileOut, "aig:" );
        if ( pGia != NULL )
        {
            Gia_ManStopP( &pAbc->pGia );
            pAbc->pGia = pGia;                
        }
    }    

    // clean up
    Util_SignalTmpFileRemove( pFileIn, fLeaveFiles );
    Util_SignalTmpFileRemove( pFileOut, fLeaveFiles );
    
    ABC_FREE( pFileIn );
    ABC_FREE( pFileOut );
    return 0;
}